

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ClassType::serializeTo(ClassType *this,ASTSerializer *serializer)

{
  Type *__n;
  Expression *__n_00;
  long lVar1;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> sVar2;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,10,"isAbstract",(ulong)this->isAbstract);
  ASTSerializer::write(serializer,0xb,"isInterface",(ulong)this->isInterface);
  ASTSerializer::write(serializer,7,"isFinal",(ulong)this->isFinal);
  if (this->firstForward != (ForwardingTypedefSymbol *)0x0) {
    ASTSerializer::write(serializer,7,"forward",(size_t)this->firstForward);
  }
  if (this->genericClass != (GenericClassDefSymbol *)0x0) {
    name._M_str = "genericClass";
    name._M_len = 0xc;
    ASTSerializer::writeLink(serializer,name,&this->genericClass->super_Symbol);
  }
  __n = getBaseClass(this);
  if (__n != (Type *)0x0) {
    ASTSerializer::write(serializer,9,"baseClass",(size_t)__n);
  }
  __n_00 = getBaseConstructorCall(this);
  if (__n_00 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0x13,"baseConstructorCall",(size_t)__n_00);
  }
  name_00._M_str = "implements";
  name_00._M_len = 10;
  ASTSerializer::startArray(serializer,name_00);
  sVar2 = getDeclaredInterfaces(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    ASTSerializer::serialize(serializer,*(Symbol **)((long)sVar2._M_ptr + lVar1),false);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void ClassType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isAbstract", isAbstract);
    serializer.write("isInterface", isInterface);
    serializer.write("isFinal", isFinal);
    if (firstForward)
        serializer.write("forward", *firstForward);
    if (genericClass)
        serializer.writeLink("genericClass", *genericClass);
    if (auto base = getBaseClass())
        serializer.write("baseClass", *base);
    if (auto expr = getBaseConstructorCall())
        serializer.write("baseConstructorCall", *expr);

    serializer.startArray("implements");
    for (auto type : getDeclaredInterfaces())
        serializer.serialize(*type);
    serializer.endArray();
}